

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::fullBuildArgs(QString *__return_storage_ptr__,MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  byte bVar6;
  CutResult CVar7;
  Data *pDVar8;
  storage_type_conflict *psVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QString local_e8;
  QString local_d0;
  ProKey local_b8;
  ProString local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify(&local_58,this,&local_88.m_string,(FileFixifyTypes)0x0,true);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar2 = local_58.d.size;
  pcVar5 = local_58.d.ptr;
  if ((Data *)local_58.d.size != (Data *)0x0) {
    pQVar1 = this->project;
    ProKey::ProKey(&local_b8,"QMAKE_MAKEFILE");
    QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,&local_b8);
    pcVar4 = local_88.m_string.d.ptr;
    local_d0.d.d = (Data *)(long)local_88.m_offset;
    local_e8.d.d = (Data *)(long)local_88.m_length;
    CVar7 = QtPrivate::QContainerImplHelper::mid
                      (local_88.m_string.d.size,(qsizetype *)&local_d0,(qsizetype *)&local_e8);
    pDVar8 = local_e8.d.d;
    if (CVar7 == Null) {
      pDVar8 = (Data *)0x0;
    }
    bVar6 = 1;
    if ((Data *)qVar2 == pDVar8) {
      psVar9 = (storage_type_conflict *)0x0;
      if (CVar7 != Null) {
        psVar9 = (storage_type_conflict *)
                 ((long)&(((QBasicAtomicInt *)pcVar4)->_q_value).super___atomic_base<int>._M_i +
                 (long)local_d0.d.d * 2);
      }
      QVar10.m_data = pcVar5;
      QVar10.m_size = qVar2;
      QVar11.m_data = psVar9;
      QVar11.m_size = qVar2;
      bVar6 = QtPrivate::equalStrings(QVar10,QVar11);
      bVar6 = bVar6 ^ 1;
    }
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar6 != 0) {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_b8,this,&local_58);
      qVar2 = local_b8.super_ProString.m_string.d.size;
      local_88.m_string.d.size = (qsizetype)local_b8.super_ProString.m_string.d.ptr;
      local_88.m_string.d.ptr = (char16_t *)local_b8.super_ProString.m_string.d.d;
      local_88.m_string.d.d = (Data *)0x2aecd0;
      local_b8.super_ProString.m_string.d.d = (Data *)0x0;
      local_b8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
      local_b8.super_ProString.m_string.d.size = 0;
      qVar3 = local_b8.super_ProString.m_string.d.size;
      local_b8.super_ProString.m_string.d.size._0_4_ = (undefined4)qVar2;
      local_b8.super_ProString.m_string.d.size._4_4_ = SUB84(qVar2,4);
      local_88.m_offset = (undefined4)local_b8.super_ProString.m_string.d.size;
      local_88.m_length = local_b8.super_ProString.m_string.d.size._4_4_;
      local_b8.super_ProString.m_string.d.size = qVar3;
      ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[5],_QString> *)&local_88);
      if ((QArrayData *)local_88.m_string.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_88.m_string.d.ptr,2,0x10);
        }
      }
      if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  pQVar1 = this->project;
  local_e8.d.d = (pQVar1->m_projectFile).d.d;
  local_e8.d.ptr = (pQVar1->m_projectFile).d.ptr;
  local_e8.d.size = (pQVar1->m_projectFile).d.size;
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_e8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  fileFixify(&local_d0,this,&local_e8,(FileFixifyTypes)0x0,true);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_b8,this,&local_d0);
  qVar2 = local_b8.super_ProString.m_string.d.size;
  local_88.m_string.d.size = (qsizetype)local_b8.super_ProString.m_string.d.ptr;
  local_88.m_string.d.ptr = (char16_t *)local_b8.super_ProString.m_string.d.d;
  local_88.m_string.d.d = (Data *)0x2b1f52;
  local_b8.super_ProString.m_string.d.d = (Data *)0x0;
  local_b8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
  local_b8.super_ProString.m_string.d.size = 0;
  qVar3 = local_b8.super_ProString.m_string.d.size;
  local_b8.super_ProString.m_string.d.size._0_4_ = (undefined4)qVar2;
  local_b8.super_ProString.m_string.d.size._4_4_ = SUB84(qVar2,4);
  local_88.m_offset = (undefined4)local_b8.super_ProString.m_string.d.size;
  local_88.m_length = local_b8.super_ProString.m_string.d.size._4_4_;
  local_b8.super_ProString.m_string.d.size = qVar3;
  ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[2],_QString> *)&local_88);
  if ((QArrayData *)local_88.m_string.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88.m_string.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_88.m_string.d.ptr,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  buildArgs(&local_88.m_string,this,true);
  QString::append((QString *)__return_storage_ptr__);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString MakefileGenerator::fullBuildArgs()
{
    QString ret;

    //output
    QString ofile = fileFixify(Option::output.fileName());
    if (!ofile.isEmpty() && ofile != project->first("QMAKE_MAKEFILE").toQStringView())
        ret += " -o " + escapeFilePath(ofile);

    //inputs
    ret += " " + escapeFilePath(fileFixify(project->projectFile()));

    // general options and arguments
    ret += buildArgs(true);

    return ret;
}